

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O2

void __thiscall netbase_tests::caddress_unserialize_v1::test_method(caddress_unserialize_v1 *this)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  string_view hex_str;
  Span<const_std::byte> sp;
  const_string file;
  const_string msg;
  char *local_c0;
  char *local_b8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  char **local_98;
  assertion_result local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  vector<CAddress,_std::allocator<CAddress>_> addresses_unserialized;
  DataStream s;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str =
       "0361bc664900000000000000000000000000000000000000000000000100007962768301000000000000000000000000000000000000000000000100f1ffffffff480400000000000000000000000000000000000000000001f1f2"
  ;
  hex_str._M_len = 0xb6;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,hex_str);
  sp.m_size = (long)local_b0._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b0._M_impl.super__Vector_impl_data._M_start;
  sp.m_data = local_b0._M_impl.super__Vector_impl_data._M_start;
  DataStream::DataStream(&s,sp);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
  local_b0._M_impl.super__Vector_impl_data._M_finish = (pointer)&addresses_unserialized;
  addresses_unserialized.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  addresses_unserialized.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  addresses_unserialized.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0._M_impl.super__Vector_impl_data._M_start = (pointer)&CAddress::V1_NETWORK;
  ParamsWrapper<CAddress::SerParams,_std::vector<CAddress,_std::allocator<CAddress>_>_>::
  Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_std::vector<CAddress,_std::allocator<CAddress>_>_>
              *)&local_b0,&s);
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x240;
  file.m_begin = (iterator)&local_68;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((vector<CAddress,_std::allocator<CAddress>_> *)fixture_addresses,
                       &addresses_unserialized);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98 = &local_c0;
  local_c0 = "fixture_addresses == addresses_unserialized";
  local_b8 = "";
  local_b0._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_b0._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_b0._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
  local_b0._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)&local_b0,1,0,WARN,0xbc6c4d,(size_t)&stack0xffffffffffffff30,
             0x240);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&addresses_unserialized);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddress_unserialize_v1)
{
    DataStream s{ParseHex(stream_addrv1_hex)};
    std::vector<CAddress> addresses_unserialized;

    s >> CAddress::V1_NETWORK(addresses_unserialized);
    BOOST_CHECK(fixture_addresses == addresses_unserialized);
}